

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O2

void amrex::Amr::fillStatePlotVarList(void)

{
  int iVar1;
  int iVar2;
  IndexType IVar3;
  StateDescriptor *pSVar4;
  string *__x;
  int typ;
  int k;
  int comp;
  
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&state_plot_vars_abi_cxx11_);
  k = 0;
  while( true ) {
    iVar1 = DescriptorList::size((DescriptorList *)AmrLevel::desc_lst);
    if (iVar1 <= k) break;
    iVar1 = 0;
    while( true ) {
      pSVar4 = DescriptorList::operator[]((DescriptorList *)AmrLevel::desc_lst,k);
      iVar2 = StateDescriptor::nComp(pSVar4);
      if (iVar2 <= iVar1) break;
      pSVar4 = DescriptorList::operator[]((DescriptorList *)AmrLevel::desc_lst,k);
      IVar3 = StateDescriptor::getType(pSVar4);
      if (IVar3.itype == 0) {
        pSVar4 = DescriptorList::operator[]((DescriptorList *)AmrLevel::desc_lst,k);
        __x = StateDescriptor::name_abi_cxx11_(pSVar4,iVar1);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&state_plot_vars_abi_cxx11_,__x);
      }
      iVar1 = iVar1 + 1;
    }
    k = k + 1;
  }
  return;
}

Assistant:

void
Amr::fillStatePlotVarList ()
{
    state_plot_vars.clear();
    const DescriptorList &desc_lst = AmrLevel::get_desc_lst();
    for (int typ(0); typ < desc_lst.size(); ++typ) {
        for (int comp(0); comp < desc_lst[typ].nComp(); ++comp) {
            if (desc_lst[typ].getType() == IndexType::TheCellType()) {
                state_plot_vars.push_back(desc_lst[typ].name(comp));
            }
        }
    }
}